

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

void Dch_ClassesCollectOneClass(Dch_Cla_t *p,Aig_Obj_t *pRepr,Vec_Ptr_t *vRoots)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  vRoots->nSize = 0;
  lVar3 = (long)pRepr->Id;
  if (0 < p->pClassSizes[lVar3]) {
    lVar6 = 0;
    do {
      pAVar2 = p->pId2Class[lVar3][lVar6];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar1 = vRoots->nCap;
        if (vRoots->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
            }
            vRoots->pArray = ppvVar4;
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar1 * 2;
            if (iVar5 <= (int)uVar1) goto LAB_008fc9fc;
            if (vRoots->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar1 << 4);
            }
            vRoots->pArray = ppvVar4;
          }
          vRoots->nCap = iVar5;
        }
LAB_008fc9fc:
        iVar5 = vRoots->nSize;
        vRoots->nSize = iVar5 + 1;
        vRoots->pArray[iVar5] = pAVar2;
      }
      lVar6 = lVar6 + 1;
      lVar3 = (long)pRepr->Id;
    } while (lVar6 < p->pClassSizes[lVar3]);
  }
  if (1 < vRoots->nSize) {
    return;
  }
  __assert_fail("Vec_PtrSize(vRoots) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                ,0x214,"void Dch_ClassesCollectOneClass(Dch_Cla_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Dch_ClassesCollectOneClass( Dch_Cla_t * p, Aig_Obj_t * pRepr, Vec_Ptr_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vRoots );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Vec_PtrPush( vRoots, pObj );
    assert( Vec_PtrSize(vRoots) > 1 ); 
}